

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Fn_CallOneArg_Test::~Fn_CallOneArg_Test(Fn_CallOneArg_Test *this)

{
  Fn_CallOneArg_Test *this_local;
  
  ~Fn_CallOneArg_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Fn, CallOneArg) {
	MockParser mock(
		"let a = fn(a) {\n"
		"  let b = a\n"
		"}\n"
		"let b = a(3)"
	);

	INS2(BC_SET_F, 0, 1);
	INS2(BC_SET_N, 1, 0);
	INS(BC_CALL, 0, 1, 1);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_MOV, 1, 0);
	INS(BC_RET, 0, 0, 0);
}